

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IColourImpl * Catch::anon_unknown_23::platformColourInstance(void)

{
  int iVar1;
  long *in_RAX;
  IMutableContext *pIVar2;
  undefined **ppuVar3;
  char *pcVar4;
  Ptr<const_Catch::IConfig> config;
  long *local_18;
  
  local_18 = in_RAX;
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_18,pIVar2);
  if (local_18 == (long *)0x0) {
LAB_0013e2d7:
    iVar1 = isatty(1);
    if (iVar1 != 0) goto LAB_0013e2e5;
LAB_0013e2f8:
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') {
      ppuVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_0013e309;
    }
    pcVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
    ppuVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar1 = (**(code **)(*local_18 + 0x80))();
    if (iVar1 != 1) {
      if (iVar1 == 0) goto LAB_0013e2d7;
      goto LAB_0013e2f8;
    }
LAB_0013e2e5:
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance != '\0') {
      ppuVar3 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      goto LAB_0013e309;
    }
    pcVar4 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    ppuVar3 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  if (iVar1 != 0) {
    __cxa_guard_release(pcVar4);
  }
LAB_0013e309:
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 0x18))();
  }
  return (IColourImpl *)ppuVar3;
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }